

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-fuzz-lattices.cpp
# Opt level: O0

Element __thiscall wasm::RandomFullLattice::getBottom(RandomFullLattice *this)

{
  long in_RSI;
  __visit_result_t<(lambda_at__workspace_llm4binary_github_license_c_cmakelists_WebAssembly[P]binaryen_src_tools_wasm_fuzz_lattices_cpp:878:5),_const_std::variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>_&>
  _Var1;
  Element EVar2;
  undefined1 local_19 [9];
  RandomFullLattice *this_local;
  
  this_local = this;
  std::
  unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
  ::operator*((unique_ptr<wasm::RandomFullLattice::LatticeImpl,_std::default_delete<wasm::RandomFullLattice::LatticeImpl>_>
               *)(in_RSI + 8));
  _Var1 = std::
          visit<wasm::RandomFullLattice::getBottom()const::__0,std::variant<wasm::analysis::Bool,wasm::analysis::Integer<unsigned_int>,wasm::analysis::ValType,wasm::analysis::Inverted<wasm::RandomFullLattice>,wasm::analysis::Array<wasm::RandomFullLattice,2ul>,wasm::analysis::Vector<wasm::RandomFullLattice>,wasm::analysis::Tuple<wasm::RandomFullLattice,wasm::RandomFullLattice>>const&>
                    ((anon_class_1_0_00000001 *)this,
                     (variant<wasm::analysis::Bool,_wasm::analysis::Integer<unsigned_int>,_wasm::analysis::ValType,_wasm::analysis::Inverted<wasm::RandomFullLattice>,_wasm::analysis::Array<wasm::RandomFullLattice,_2UL>,_wasm::analysis::Vector<wasm::RandomFullLattice>,_wasm::analysis::Tuple<wasm::RandomFullLattice,_wasm::RandomFullLattice>_>
                      *)local_19);
  EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Head_base<0UL,_void_*,_false>.
  _M_head_impl = _Var1.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                 super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                 super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.
                 super__Head_base<0UL,_void_*,_false>._M_head_impl;
  EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.super___uniq_ptr_impl<void,_void_(*)(void_*)>.
  _M_t.super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>.super__Tuple_impl<1UL,_void_(*)(void_*)>.
  super__Head_base<1UL,_void_(*)(void_*),_false>._M_head_impl =
       (_Head_base<1UL,_void_(*)(void_*),_false>)(_Head_base<1UL,_void_(*)(void_*),_false>)this;
  return (Element)EVar2.super_unique_ptr<void,_void_(*)(void_*)>._M_t.
                  super___uniq_ptr_impl<void,_void_(*)(void_*)>._M_t.
                  super__Tuple_impl<0UL,_void_*,_void_(*)(void_*)>;
}

Assistant:

RandomFullLattice::Element RandomFullLattice::getBottom() const noexcept {
  return std::visit(
    [](const auto& l) -> Element { return ElementImpl{l.getBottom()}; },
    (const FullLatticeVariant&)*lattice);
}